

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

FT_Error TT_Set_Var_Design(TT_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  FT_Memory memory_00;
  GX_Blend pGVar1;
  FT_MM_Var *pFVar2;
  bool bVar3;
  FT_Fixed *pFVar4;
  FT_Var_Axis *local_80;
  FT_Var_Axis *a;
  FT_Var_Named_Style *named_style;
  FT_UInt instance_index;
  FT_Bool have_diff;
  FT_Fixed *normalized;
  FT_Fixed *n;
  FT_Fixed *c;
  FT_Memory memory;
  FT_UInt i;
  FT_MM_Var *mmvar;
  GX_Blend blend;
  FT_Fixed *pFStack_28;
  FT_Error error;
  FT_Fixed *coords_local;
  TT_Face pTStack_18;
  FT_UInt num_coords_local;
  TT_Face face_local;
  
  blend._4_4_ = 0;
  memory_00 = (face->root).memory;
  _instance_index = (FT_Fixed *)0x0;
  bVar3 = false;
  pFStack_28 = coords;
  coords_local._4_4_ = num_coords;
  pTStack_18 = face;
  if ((face->blend != (GX_Blend)0x0) ||
     (blend._4_4_ = TT_Get_MM_Var(face,(FT_MM_Var **)0x0), blend._4_4_ == 0)) {
    pGVar1 = pTStack_18->blend;
    pFVar2 = pGVar1->mmvar;
    if (pFVar2->num_axis < coords_local._4_4_) {
      coords_local._4_4_ = pFVar2->num_axis;
    }
    if (pGVar1->coords == (FT_Fixed *)0x0) {
      pFVar4 = (FT_Fixed *)
               ft_mem_realloc(memory_00,8,0,(ulong)pFVar2->num_axis,(void *)0x0,
                              (FT_Error *)((long)&blend + 4));
      pGVar1->coords = pFVar4;
      if (blend._4_4_ != 0) goto LAB_00349c21;
    }
    n = pGVar1->coords;
    normalized = pFStack_28;
    for (memory._4_4_ = 0; memory._4_4_ < coords_local._4_4_; memory._4_4_ = memory._4_4_ + 1) {
      if (*n != *normalized) {
        *n = *normalized;
        bVar3 = true;
      }
      normalized = normalized + 1;
      n = n + 1;
    }
    if (((pTStack_18->root).face_index & 0x7fff0000U) == 0) {
      local_80 = pFVar2->axis + coords_local._4_4_;
      for (; memory._4_4_ < pFVar2->num_axis; memory._4_4_ = memory._4_4_ + 1) {
        if (*n != local_80->def) {
          *n = local_80->def;
          bVar3 = true;
        }
        local_80 = local_80 + 1;
        n = n + 1;
      }
    }
    else {
      normalized = pFVar2->namedstyle
                   [(ulong)((uint)((ulong)(pTStack_18->root).face_index >> 0x10) & 0xffff) - 1].
                   coords + coords_local._4_4_;
      for (; memory._4_4_ < pFVar2->num_axis; memory._4_4_ = memory._4_4_ + 1) {
        if (*n != *normalized) {
          *n = *normalized;
          bVar3 = true;
        }
        normalized = normalized + 1;
        n = n + 1;
      }
    }
    if ((pGVar1->normalizedcoords != (FT_Fixed *)0x0) && (!bVar3)) {
      return -1;
    }
    _instance_index =
         (FT_Fixed *)
         ft_mem_realloc(memory_00,8,0,(ulong)pFVar2->num_axis,(void *)0x0,
                        (FT_Error *)((long)&blend + 4));
    if (blend._4_4_ == 0) {
      if (pTStack_18->blend->avar_loaded == '\0') {
        ft_var_load_avar(pTStack_18);
      }
      ft_var_to_normalized(pTStack_18,coords_local._4_4_,pGVar1->coords,_instance_index);
      blend._4_4_ = tt_set_mm_blend(pTStack_18,pFVar2->num_axis,_instance_index,'\0');
      if (blend._4_4_ == 0) {
        if (coords_local._4_4_ == 0) {
          (pTStack_18->root).face_flags = (pTStack_18->root).face_flags & 0xffffffffffff7fff;
        }
        else {
          (pTStack_18->root).face_flags = (pTStack_18->root).face_flags | 0x8000;
        }
      }
    }
  }
LAB_00349c21:
  ft_mem_free(memory_00,_instance_index);
  return blend._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Set_Var_Design( TT_Face    face,
                     FT_UInt    num_coords,
                     FT_Fixed*  coords )
  {
    FT_Error    error  = FT_Err_Ok;
    GX_Blend    blend;
    FT_MM_Var*  mmvar;
    FT_UInt     i;
    FT_Memory   memory = face->root.memory;

    FT_Fixed*  c;
    FT_Fixed*  n;
    FT_Fixed*  normalized = NULL;

    FT_Bool  have_diff = 0;


    if ( !face->blend )
    {
      if ( FT_SET_ERROR( TT_Get_MM_Var( face, NULL ) ) )
        goto Exit;
    }

    blend = face->blend;
    mmvar = blend->mmvar;

    if ( num_coords > mmvar->num_axis )
    {
      FT_TRACE2(( "TT_Set_Var_Design:"
                  " only using first %d of %d coordinates\n",
                  mmvar->num_axis, num_coords ));
      num_coords = mmvar->num_axis;
    }

    if ( !blend->coords )
    {
      if ( FT_NEW_ARRAY( blend->coords, mmvar->num_axis ) )
        goto Exit;
    }

    c = blend->coords;
    n = coords;
    for ( i = 0; i < num_coords; i++, n++, c++ )
    {
      if ( *c != *n )
      {
        *c        = *n;
        have_diff = 1;
      }
    }

    if ( FT_IS_NAMED_INSTANCE( FT_FACE( face ) ) )
    {
      FT_UInt              instance_index;
      FT_Var_Named_Style*  named_style;


      instance_index = (FT_UInt)face->root.face_index >> 16;
      named_style    = mmvar->namedstyle + instance_index - 1;

      n = named_style->coords + num_coords;
      for ( ; i < mmvar->num_axis; i++, n++, c++ )
      {
        if ( *c != *n )
        {
          *c        = *n;
          have_diff = 1;
        }
      }
    }
    else
    {
      FT_Var_Axis*  a;


      a = mmvar->axis + num_coords;
      for ( ; i < mmvar->num_axis; i++, a++, c++ )
      {
        if ( *c != a->def )
        {
          *c        = a->def;
          have_diff = 1;
        }
      }
    }

    /* return value -1 indicates `no change';                      */
    /* we can exit early if `normalizedcoords' is already computed */
    if ( blend->normalizedcoords && !have_diff )
      return -1;

    if ( FT_NEW_ARRAY( normalized, mmvar->num_axis ) )
      goto Exit;

    if ( !face->blend->avar_loaded )
      ft_var_load_avar( face );

    FT_TRACE5(( "TT_Set_Var_Design:\n" ));
    FT_TRACE5(( "  normalized design coordinates:\n" ));
    ft_var_to_normalized( face, num_coords, blend->coords, normalized );

    error = tt_set_mm_blend( face, mmvar->num_axis, normalized, 0 );
    if ( error )
      goto Exit;

    if ( num_coords )
      face->root.face_flags |= FT_FACE_FLAG_VARIATION;
    else
      face->root.face_flags &= ~FT_FACE_FLAG_VARIATION;

  Exit:
    FT_FREE( normalized );
    return error;
  }